

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall cmFileAPI::BuildCMake(Value *__return_storage_ptr__,cmFileAPI *this)

{
  Value *pVVar1;
  string *psVar2;
  Value *pVVar3;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmake::ReportVersionJson(&VStack_48,this->CMakeInstance);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar1,&VStack_48);
  Json::Value::~Value(&VStack_48);
  Json::Value::Value(&VStack_48,objectValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"paths");
  pVVar1 = Json::Value::operator=(pVVar1,&VStack_48);
  Json::Value::~Value(&VStack_48);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  Json::Value::Value(&VStack_48,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"cmake");
  Json::Value::operator=(pVVar3,&VStack_48);
  Json::Value::~Value(&VStack_48);
  psVar2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  Json::Value::Value(&VStack_48,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"ctest");
  Json::Value::operator=(pVVar3,&VStack_48);
  Json::Value::~Value(&VStack_48);
  psVar2 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  Json::Value::Value(&VStack_48,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"cpack");
  Json::Value::operator=(pVVar3,&VStack_48);
  Json::Value::~Value(&VStack_48);
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  Json::Value::Value(&VStack_48,psVar2);
  pVVar1 = Json::Value::operator[](pVVar1,"root");
  Json::Value::operator=(pVVar1,&VStack_48);
  Json::Value::~Value(&VStack_48);
  (**(code **)((long)((this->CMakeInstance->GlobalGenerator)._M_t.
                      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->
                     _vptr_cmGlobalGenerator + 0x30))(&VStack_48);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"generator");
  Json::Value::operator=(pVVar1,&VStack_48);
  Json::Value::~Value(&VStack_48);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCMake()
{
  Json::Value cmake = Json::objectValue;
  cmake["version"] = this->CMakeInstance->ReportVersionJson();
  Json::Value& cmake_paths = cmake["paths"] = Json::objectValue;
  cmake_paths["cmake"] = cmSystemTools::GetCMakeCommand();
  cmake_paths["ctest"] = cmSystemTools::GetCTestCommand();
  cmake_paths["cpack"] = cmSystemTools::GetCPackCommand();
  cmake_paths["root"] = cmSystemTools::GetCMakeRoot();
  cmake["generator"] = this->CMakeInstance->GetGlobalGenerator()->GetJson();
  return cmake;
}